

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O1

void __thiscall
MineBanGameCommand::trigger
          (MineBanGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  long lVar1;
  char *pcVar2;
  undefined8 uVar3;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  undefined8 local_28;
  char *local_20;
  
  args_2 = (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_str;
  if (parameters._M_len == 0) {
    pcVar2 = "Error: Too few parameters. Syntax: mineban <player>";
    uVar3 = 0x33;
  }
  else {
    lVar1 = RenX::Server::getPlayerByPartName(source,parameters._M_len,args_2);
    if (lVar1 == 0) {
      pcVar2 = "Error: Player not found.";
      uVar3 = 0x18;
    }
    else {
      if (player->access <= *(int *)(lVar1 + 0x1b0)) {
        local_28 = 0x29;
        local_20 = "Error: You can not mine-ban higher level ";
        local_38._M_len = pluginInstance.m_staffTitle._M_string_length;
        local_38._M_str = pluginInstance.m_staffTitle._M_dataplus._M_p;
        local_48._M_len = 2;
        local_48._M_str = "s.";
        jessilib::
        join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  (&local_68,(jessilib *)&local_28,&local_38,&local_48,args_2);
        RenX::Server::sendMessage(source,player,local_68._M_string_length,local_68._M_dataplus._M_p)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        return;
      }
      RenX::Server::mineBan((PlayerInfo *)source);
      pcVar2 = "Player can no longer place mines.";
      uVar3 = 0x21;
    }
  }
  RenX::Server::sendMessage(source,player,uVar3,pcVar2);
  return;
}

Assistant:

void MineBanGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	if (!parameters.empty())
	{
		RenX::PlayerInfo *target = source->getPlayerByPartName(parameters);
		if (target == nullptr)
			source->sendMessage(*player, "Error: Player not found."sv);
		else if (target->access >= player->access)
			source->sendMessage(*player, jessilib::join<std::string>("Error: You can not mine-ban higher level "sv, pluginInstance.getStaffTitle(), "s."sv));
		else
		{
			source->mineBan(*target);
			source->sendMessage(*player, "Player can no longer place mines."sv);
		}
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: mineban <player>"sv);
}